

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

CURLcode file_do(Curl_easy *data,_Bool *done)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  CURLcode CVar4;
  __off64_t _Var5;
  size_t blen;
  DIR *__dirp;
  dirent64 *pdVar6;
  size_t blen_00;
  curltime cVar7;
  curltime now;
  size_t local_1e0;
  int local_1cc;
  dirent *entry;
  DIR *dir;
  size_t local_1a0;
  size_t bytestoread;
  ssize_t nread;
  char local_188 [4];
  int headerlen;
  char header [80];
  tm *tm;
  tm buffer;
  time_t filetime;
  size_t xfer_blen;
  char *xfer_buf;
  FILEPROTO *file;
  int fd;
  _Bool fstated;
  _Bool size_known;
  curl_off_t expected_size;
  stat statbuf;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  statbuf.__glibc_reserved[2]._4_4_ = CURLE_OK;
  _fd = 0xffffffffffffffff;
  file._6_1_ = 0;
  *done = true;
  if ((*(uint *)&(data->state).field_0x7be >> 0x13 & 1) == 0) {
    xfer_buf = (char *)(data->req).p.file;
    file._0_4_ = ((FILEPROTO *)xfer_buf)->fd;
    iVar3 = fstat64((int)file,(stat64 *)&expected_size);
    if (iVar3 != -1) {
      if (((uint)statbuf.st_nlink & 0xf000) != 0x4000) {
        _fd = statbuf.st_rdev;
      }
      (data->info).filetime = statbuf.st_atim.tv_nsec;
      file._6_1_ = 1;
    }
    if (((((file._6_1_ & 1) == 0) || ((data->state).range != (char *)0x0)) ||
        ((data->set).timecondition == '\0')) ||
       (_Var2 = Curl_meets_timecondition(data,(data->info).filetime), _Var2)) {
      if ((file._6_1_ & 1) != 0) {
        if (-1 < (long)_fd) {
          iVar3 = curl_msnprintf(local_188,0x50,"Content-Length: %ld\r\n",_fd);
          statbuf.__glibc_reserved[2]._4_4_ = Curl_client_write(data,4,local_188,(long)iVar3);
          if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) {
            return statbuf.__glibc_reserved[2]._4_4_;
          }
          CVar4 = Curl_client_write(data,4,"Accept-ranges: bytes\r\n",0x16);
          if (CVar4 != CURLE_OK) {
            return CVar4;
          }
          statbuf.__glibc_reserved[2]._4_4_ = CURLE_OK;
        }
        buffer.tm_zone = (char *)statbuf.st_atim.tv_nsec;
        statbuf.__glibc_reserved[2]._4_4_ = Curl_gmtime(statbuf.st_atim.tv_nsec,(tm *)&tm);
        if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) {
          return statbuf.__glibc_reserved[2]._4_4_;
        }
        if (buffer.tm_mon == 0) {
          local_1cc = 6;
        }
        else {
          local_1cc = buffer.tm_mon + -1;
        }
        iVar3 = curl_msnprintf(local_188,0x50,
                               "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                               Curl_wkday[local_1cc],(ulong)(uint)buffer.tm_min,
                               Curl_month[buffer.tm_hour],buffer.tm_mday + 0x76c,buffer.tm_sec,
                               tm._4_4_,tm._0_4_);
        statbuf.__glibc_reserved[2]._4_4_ = Curl_client_write(data,4,local_188,(long)iVar3);
        if (statbuf.__glibc_reserved[2]._4_4_ == CURLE_OK) {
          statbuf.__glibc_reserved[2]._4_4_ = Curl_client_write(data,4,"\r\n",2);
        }
        if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) {
          return statbuf.__glibc_reserved[2]._4_4_;
        }
        Curl_pgrsSetDownloadSize(data,_fd);
        if ((*(uint *)&(data->req).field_0xd1 >> 0x11 & 1) != 0) {
          return CURLE_OK;
        }
      }
      statbuf.__glibc_reserved[2]._4_4_ = Curl_range(data);
      data_local._4_4_ = statbuf.__glibc_reserved[2]._4_4_;
      if (statbuf.__glibc_reserved[2]._4_4_ == CURLE_OK) {
        if ((data->state).resume_from < 0) {
          if ((file._6_1_ & 1) == 0) {
            Curl_failf(data,"cannot get the size of file.");
            return CURLE_READ_ERROR;
          }
          (data->state).resume_from = statbuf.st_rdev + (data->state).resume_from;
        }
        if (0 < (data->state).resume_from) {
          if ((long)_fd < (data->state).resume_from) {
            Curl_failf(data,"failed to resume file:// transfer");
            return CURLE_BAD_DOWNLOAD_RESUME;
          }
          _fd = _fd - (data->state).resume_from;
        }
        if (0 < (data->req).maxdownload) {
          _fd = (data->req).maxdownload;
        }
        if (((file._6_1_ & 1) == 0) || ((long)_fd < 1)) {
          file._7_1_ = 0;
        }
        else {
          file._7_1_ = 1;
        }
        if (file._7_1_ != 0) {
          Curl_pgrsSetDownloadSize(data,_fd);
        }
        if ((data->state).resume_from != 0) {
          if (((uint)statbuf.st_nlink & 0xf000) == 0x4000) {
            return CURLE_BAD_DOWNLOAD_RESUME;
          }
          lVar1 = (data->state).resume_from;
          _Var5 = lseek64((int)file,(data->state).resume_from,0);
          if (lVar1 != _Var5) {
            return CURLE_BAD_DOWNLOAD_RESUME;
          }
        }
        statbuf.__glibc_reserved[2]._4_4_ =
             Curl_multi_xfer_buf_borrow(data,(char **)&xfer_blen,(size_t *)&filetime);
        if (statbuf.__glibc_reserved[2]._4_4_ == CURLE_OK) {
          if (((uint)statbuf.st_nlink & 0xf000) == 0x4000) {
            __dirp = opendir(*(char **)xfer_buf);
            if (__dirp == (DIR *)0x0) {
              statbuf.__glibc_reserved[2]._4_4_ = CURLE_READ_ERROR;
            }
            else {
              while (pdVar6 = readdir64(__dirp), pdVar6 != (dirent64 *)0x0) {
                if (pdVar6->d_name[0] != '.') {
                  blen_00 = strlen(pdVar6->d_name);
                  statbuf.__glibc_reserved[2]._4_4_ =
                       Curl_client_write(data,1,pdVar6->d_name,blen_00);
                  if ((statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) ||
                     (statbuf.__glibc_reserved[2]._4_4_ = Curl_client_write(data,1,"\n",1),
                     statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK)) break;
                }
              }
              closedir(__dirp);
LAB_00138cbe:
              iVar3 = Curl_pgrsUpdate(data);
              if (iVar3 != 0) {
                statbuf.__glibc_reserved[2]._4_4_ = CURLE_ABORTED_BY_CALLBACK;
              }
            }
          }
          else {
            do {
              if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) goto LAB_00138cbe;
              if ((file._7_1_ & 1) == 0) {
                local_1a0 = filetime - 1;
              }
              else {
                if ((long)_fd < filetime + -1) {
                  local_1e0 = curlx_sotouz(_fd);
                }
                else {
                  local_1e0 = filetime - 1;
                }
                local_1a0 = local_1e0;
              }
              blen = read((int)file,(void *)xfer_blen,local_1a0);
              if (((long)blen < 1) ||
                 ((*(undefined1 *)(xfer_blen + blen) = 0, (file._7_1_ & 1) != 0 && (_fd == 0))))
              goto LAB_00138cbe;
              if ((file._7_1_ & 1) != 0) {
                _fd = _fd - blen;
              }
              statbuf.__glibc_reserved[2]._4_4_ = Curl_client_write(data,1,(char *)xfer_blen,blen);
              if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) break;
              iVar3 = Curl_pgrsUpdate(data);
              if (iVar3 == 0) {
                cVar7 = Curl_now();
                now._12_4_ = 0;
                now.tv_sec = SUB128(cVar7._0_12_,0);
                now.tv_usec = SUB124(cVar7._0_12_,8);
                statbuf.__glibc_reserved[2]._4_4_ = Curl_speedcheck(data,now);
              }
              else {
                statbuf.__glibc_reserved[2]._4_4_ = CURLE_ABORTED_BY_CALLBACK;
              }
            } while (statbuf.__glibc_reserved[2]._4_4_ == CURLE_OK);
          }
        }
        Curl_multi_xfer_buf_release(data,(char *)xfer_blen);
        data_local._4_4_ = statbuf.__glibc_reserved[2]._4_4_;
      }
    }
    else {
      data_local._4_4_ = CURLE_OK;
    }
  }
  else {
    data_local._4_4_ = file_upload(data);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode file_do(struct Curl_easy *data, bool *done)
{
  /* This implementation ignores the hostname in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size = -1;
  bool size_known;
  bool fstated = FALSE;
  int fd;
  struct FILEPROTO *file;
  char *xfer_buf;
  size_t xfer_blen;

  *done = TRUE; /* unconditionally */

  if(data->state.upload)
    return file_upload(data);

  file = data->req.p.file;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    if(!S_ISDIR(statbuf.st_mode))
      expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition &&
     !Curl_meets_timecondition(data, data->info.filetime))
    return CURLE_OK;

  if(fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    int headerlen;
    static const char accept_ranges[]= { "Accept-ranges: bytes\r\n" };
    if(expected_size >= 0) {
      headerlen =
        msnprintf(header, sizeof(header), "Content-Length: %" FMT_OFF_T "\r\n",
                  expected_size);
      result = Curl_client_write(data, CLIENTWRITE_HEADER, header, headerlen);
      if(result)
        return result;

      result = Curl_client_write(data, CLIENTWRITE_HEADER,
                                 accept_ranges, sizeof(accept_ranges) - 1);
      if(result != CURLE_OK)
        return result;
    }

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    headerlen =
      msnprintf(header, sizeof(header),
                "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                Curl_wkday[tm->tm_wday ? tm->tm_wday-1 : 6],
                tm->tm_mday,
                Curl_month[tm->tm_mon],
                tm->tm_year + 1900,
                tm->tm_hour,
                tm->tm_min,
                tm->tm_sec);
    result = Curl_client_write(data, CLIENTWRITE_HEADER, header, headerlen);
    if(!result)
      /* end of headers */
      result = Curl_client_write(data, CLIENTWRITE_HEADER, "\r\n", 2);
    if(result)
      return result;
    /* set the file size to make it available post transfer */
    Curl_pgrsSetDownloadSize(data, expected_size);
    if(data->req.no_body)
      return CURLE_OK;
  }

  /* Check whether file range has been specified */
  result = Curl_range(data);
  if(result)
    return result;

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream if the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "cannot get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from > 0) {
    /* We check explicitly if we have a start offset, because
     * expected_size may be -1 if we do not know how large the file is,
     * in which case we should not adjust it. */
    if(data->state.resume_from <= expected_size)
      expected_size -= data->state.resume_from;
    else {
      failf(data, "failed to resume file:// transfer");
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size <= 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(size_known)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(!S_ISDIR(statbuf.st_mode)) {
#if defined(__AMIGA__) || defined(__MINGW32CE__)
      if(data->state.resume_from !=
          lseek(fd, (off_t)data->state.resume_from, SEEK_SET))
#else
      if(data->state.resume_from !=
          lseek(fd, data->state.resume_from, SEEK_SET))
#endif
        return CURLE_BAD_DOWNLOAD_RESUME;
    }
    else {
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
  }

  result = Curl_multi_xfer_buf_borrow(data, &xfer_buf, &xfer_blen);
  if(result)
    goto out;

  if(!S_ISDIR(statbuf.st_mode)) {
    while(!result) {
      ssize_t nread;
      /* Do not fill a whole buffer if we want less than all data */
      size_t bytestoread;

      if(size_known) {
        bytestoread = (expected_size < (curl_off_t)(xfer_blen-1)) ?
          curlx_sotouz(expected_size) : (xfer_blen-1);
      }
      else
        bytestoread = xfer_blen-1;

      nread = read(fd, xfer_buf, bytestoread);

      if(nread > 0)
        xfer_buf[nread] = 0;

      if(nread <= 0 || (size_known && (expected_size == 0)))
        break;

      if(size_known)
        expected_size -= nread;

      result = Curl_client_write(data, CLIENTWRITE_BODY, xfer_buf, nread);
      if(result)
        goto out;

      if(Curl_pgrsUpdate(data))
        result = CURLE_ABORTED_BY_CALLBACK;
      else
        result = Curl_speedcheck(data, Curl_now());
      if(result)
        goto out;
    }
  }
  else {
#ifdef HAVE_OPENDIR
    DIR *dir = opendir(file->path);
    struct dirent *entry;

    if(!dir) {
      result = CURLE_READ_ERROR;
      goto out;
    }
    else {
      while((entry = readdir(dir))) {
        if(entry->d_name[0] != '.') {
          result = Curl_client_write(data, CLIENTWRITE_BODY,
                   entry->d_name, strlen(entry->d_name));
          if(result)
            break;
          result = Curl_client_write(data, CLIENTWRITE_BODY, "\n", 1);
          if(result)
            break;
        }
      }
      closedir(dir);
    }
#else
    failf(data, "Directory listing not yet implemented on this platform.");
    result = CURLE_READ_ERROR;
#endif
  }

  if(Curl_pgrsUpdate(data))
    result = CURLE_ABORTED_BY_CALLBACK;

out:
  Curl_multi_xfer_buf_release(data, xfer_buf);
  return result;
}